

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O0

gkc_summary * gkc_combine(gkc_summary *s1,gkc_summary *s2)

{
  size_t sVar1;
  gkc_tuple *pgVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  gkc_tuple *tnew;
  gkc_tuple *tcur2;
  gkc_tuple *tcur1;
  list *cur2;
  list *cur1;
  gkc_summary *snew;
  gkc_summary *s2_local;
  gkc_summary *s1_local;
  
  if ((s1->epsilon != s2->epsilon) || (NAN(s1->epsilon) || NAN(s2->epsilon))) {
    s1_local = (gkc_summary *)0x0;
  }
  else {
    s1_local = gkc_summary_alloc(s1->epsilon);
    cur2 = (s1->head).next;
    tcur1 = (gkc_tuple *)(s2->head).next;
    while (cur2 != &s1->head && tcur1 != (gkc_tuple *)&s2->head) {
      pgVar2 = gkc_alloc(s1_local);
      if (cur2[-2].next < (list *)tcur1[-1].delta) {
        pgVar2->value = (uint64_t)cur2[-2].next;
        pgVar2->g = (double)cur2[-1].prev;
        pgVar2->delta = (uint64_t)cur2[-1].next;
        cur2 = cur2->next;
      }
      else {
        pgVar2->value = tcur1[-1].delta;
        pgVar2->g = (double)tcur1[-1].node.prev;
        pgVar2->delta = (uint64_t)tcur1[-1].node.next;
        tcur1 = (gkc_tuple *)tcur1->g;
      }
      list_add_tail(&s1_local->head,&pgVar2->node);
      sVar1 = s1_local->nr_elems;
      auVar5._8_4_ = (int)(sVar1 >> 0x20);
      auVar5._0_8_ = sVar1;
      auVar5._12_4_ = 0x45300000;
      dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) + pgVar2->g;
      uVar3 = (ulong)dVar4;
      s1_local->nr_elems = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
    }
    for (; cur2 != &s1->head; cur2 = cur2->next) {
      pgVar2 = gkc_alloc(s1_local);
      pgVar2->value = (uint64_t)cur2[-2].next;
      pgVar2->g = (double)cur2[-1].prev;
      pgVar2->delta = (uint64_t)cur2[-1].next;
      list_add_tail(&s1_local->head,&pgVar2->node);
      sVar1 = s1_local->nr_elems;
      auVar6._8_4_ = (int)(sVar1 >> 0x20);
      auVar6._0_8_ = sVar1;
      auVar6._12_4_ = 0x45300000;
      dVar4 = (auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) + pgVar2->g;
      uVar3 = (ulong)dVar4;
      s1_local->nr_elems = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
    }
    for (; tcur1 != (gkc_tuple *)&s2->head; tcur1 = (gkc_tuple *)tcur1->g) {
      pgVar2 = gkc_alloc(s1_local);
      pgVar2->value = tcur1[-1].delta;
      pgVar2->g = (double)tcur1[-1].node.prev;
      pgVar2->delta = (uint64_t)tcur1[-1].node.next;
      list_add_tail(&s1_local->head,&pgVar2->node);
      sVar1 = s1_local->nr_elems;
      auVar7._8_4_ = (int)(sVar1 >> 0x20);
      auVar7._0_8_ = sVar1;
      auVar7._12_4_ = 0x45300000;
      dVar4 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) + pgVar2->g;
      uVar3 = (ulong)dVar4;
      s1_local->nr_elems = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
    }
    s1_local->max_alloced = s1_local->alloced;
    gkc_compress(s1_local);
  }
  return s1_local;
}

Assistant:

struct gkc_summary *gkc_combine(struct gkc_summary *s1, struct gkc_summary *s2)
{
    struct gkc_summary *snew;
    struct list *cur1, *cur2;
    struct gkc_tuple *tcur1, *tcur2, *tnew;

    if (s1->epsilon != s2->epsilon) {
        return NULL;
    }
    snew = gkc_summary_alloc(s1->epsilon);

    cur1 = s1->head.next;
    cur2 = s2->head.next;
    while (cur1 != &s1->head && cur2 != &s2->head) {
        tcur1 = list_to_tuple(cur1);
        tcur2 = list_to_tuple(cur2);

        tnew = gkc_alloc(snew);
        if (tcur1->value < tcur2->value) {
            tnew->value = tcur1->value;
            tnew->g = tcur1->g;
            tnew->delta = tcur1->delta;
            cur1 = cur1->next;
        } else {
            tnew->value = tcur2->value;
            tnew->g = tcur2->g;
            tnew->delta = tcur2->delta;
            cur2 = cur2->next;
        }
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
    }
    while (cur1 != &s1->head) {
        tcur1 = list_to_tuple(cur1);

        tnew = gkc_alloc(snew);
        tnew->value = tcur1->value;
        tnew->g = tcur1->g;
        tnew->delta = tcur1->delta;
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
        cur1 = cur1->next;
    }
    while (cur2 != &s2->head) {
        tcur2 = list_to_tuple(cur2);

        tnew = gkc_alloc(snew);
        tnew->value = tcur2->value;
        tnew->g = tcur2->g;
        tnew->delta = tcur2->delta;
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
        cur2 = cur2->next;
    }
    snew->max_alloced = snew->alloced;
    gkc_compress(snew);

    return snew;
}